

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::MinutesFun::GetFunctions(void)

{
  scalar_function_t timetz_func;
  ScalarFunctionSet *in_RDI;
  function_statistics_t ts_stats;
  function_statistics_t in_stack_ffffffffffffff28;
  element_type *in_stack_ffffffffffffff30;
  code *local_c0 [2];
  code *local_b0;
  code *local_a8;
  code *local_a0 [2];
  code *local_90;
  code *local_88;
  code *local_80 [2];
  code *local_70;
  code *local_68;
  code *local_60 [2];
  code *local_50;
  code *local_48;
  code *local_40 [2];
  code *local_30;
  code *local_28;
  
  ts_stats = (function_statistics_t)0x1d82edd;
  LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff28,BIGINT);
  local_40[1] = (code *)0x0;
  local_40[0] = DatePart::UnaryFunction<duckdb::date_t,long,duckdb::DatePart::MinutesOperator>;
  local_28 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_30 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_60[1] = (code *)0x0;
  local_60[0] = DatePart::UnaryFunction<duckdb::timestamp_t,long,duckdb::DatePart::MinutesOperator>;
  local_48 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_50 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_80[1] = (code *)0x0;
  local_80[0] = ScalarFunction::
                UnaryFunction<duckdb::interval_t,long,duckdb::DatePart::MinutesOperator>;
  local_68 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_70 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_a0[1] = (code *)0x0;
  local_a0[0] = ScalarFunction::
                UnaryFunction<duckdb::dtime_t,long,duckdb::DatePart::MinutesOperator>;
  local_88 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_90 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  local_c0[1] = (code *)0x0;
  local_c0[0] = ScalarFunction::
                UnaryFunction<duckdb::dtime_tz_t,long,duckdb::DatePart::MinutesOperator>;
  local_a8 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
  local_b0 = ::std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
  timetz_func.super__Function_base._M_functor._8_8_ =
       DatePart::MinutesOperator::PropagateStatistics<duckdb::date_t>;
  timetz_func.super__Function_base._M_functor._M_unused._M_object = local_c0;
  timetz_func.super__Function_base._M_manager =
       DatePart::MinutesOperator::PropagateStatistics<duckdb::timestamp_t>;
  timetz_func._M_invoker = DatePart::MinutesOperator::PropagateStatistics<duckdb::dtime_t>;
  GetGenericTimePartFunction
            (in_RDI,(LogicalType *)&stack0xffffffffffffff28,(scalar_function_t *)local_40,
             (scalar_function_t *)local_60,(scalar_function_t *)local_80,
             (scalar_function_t *)local_a0,timetz_func,
             DatePart::MinutesOperator::PropagateStatistics<duckdb::dtime_tz_t>,ts_stats,
             in_stack_ffffffffffffff28,(function_statistics_t)in_stack_ffffffffffffff30);
  ::std::_Function_base::~_Function_base((_Function_base *)local_c0);
  ::std::_Function_base::~_Function_base((_Function_base *)local_a0);
  ::std::_Function_base::~_Function_base((_Function_base *)local_80);
  ::std::_Function_base::~_Function_base((_Function_base *)local_60);
  ::std::_Function_base::~_Function_base((_Function_base *)local_40);
  LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffff28);
  return in_RDI;
}

Assistant:

ScalarFunctionSet MinutesFun::GetFunctions() {
	return GetTimePartFunction<DatePart::MinutesOperator>();
}